

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_6::TwoLevelIterator::InitDataBlock(TwoLevelIterator *this)

{
  ulong uVar1;
  int iVar2;
  Iterator *data_iter;
  ulong __n;
  ulong uVar3;
  long in_FS_OFFSET;
  Slice handle;
  Slice local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->index_iter_).valid_ == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      SetDataIterator(this,(Iterator *)0x0);
      return;
    }
    goto LAB_00660aaa;
  }
  local_38 = IteratorWrapper::value(&this->index_iter_);
  uVar3 = local_38.size_;
  if ((this->data_iter_).iter_ == (Iterator *)0x0) {
LAB_00660a30:
    data_iter = (*this->block_function_)(this->arg_,&this->options_,&local_38);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&this->data_block_handle_,0,(this->data_block_handle_)._M_string_length,
               local_38.data_,local_38.size_);
    SetDataIterator(this,data_iter);
  }
  else {
    uVar1 = (this->data_block_handle_)._M_string_length;
    __n = uVar1;
    if (uVar3 < uVar1) {
      __n = uVar3;
    }
    iVar2 = bcmp(local_38.data_,(this->data_block_handle_)._M_dataplus._M_p,__n);
    if (iVar2 != 0 || uVar3 != uVar1) goto LAB_00660a30;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_00660aaa:
  __stack_chk_fail();
}

Assistant:

void TwoLevelIterator::InitDataBlock() {
  if (!index_iter_.Valid()) {
    SetDataIterator(nullptr);
  } else {
    Slice handle = index_iter_.value();
    if (data_iter_.iter() != nullptr &&
        handle.compare(data_block_handle_) == 0) {
      // data_iter_ is already constructed with this iterator, so
      // no need to change anything
    } else {
      Iterator* iter = (*block_function_)(arg_, options_, handle);
      data_block_handle_.assign(handle.data(), handle.size());
      SetDataIterator(iter);
    }
  }
}